

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineMultisampleImageTests.cpp
# Opt level: O1

void vkt::pipeline::anon_unknown_0::addTestCasesWithFunctions
               (TestCaseGroup *group,Function initPrograms,Function testFunc)

{
  int iVar1;
  int iVar2;
  TestContext *pTVar3;
  pointer pcVar4;
  long lVar5;
  TestNode *pTVar6;
  ostream *poVar7;
  char *__s;
  long lVar8;
  bool bVar9;
  IVec2 size [2];
  string name;
  long local_250;
  string local_240;
  TestNode *local_220;
  string local_218;
  TestNode *local_1f8;
  long local_1f0;
  TestNode *local_1e8;
  VkFormat local_1dc;
  int local_1d8 [4];
  _func_int **local_1c8;
  TestContext *local_1c0;
  long local_1b8;
  long local_1b0;
  long *local_1a8 [2];
  long local_198 [12];
  ios_base local_138 [264];
  
  local_1d8[0] = 0x40;
  local_1d8[1] = 0x40;
  local_1d8[2] = 0x4f;
  local_1d8[3] = 0x1f;
  local_250 = 0;
  local_1f8 = &group->super_TestNode;
  local_1c8 = (_func_int **)initPrograms;
  local_1c0 = (TestContext *)testFunc;
  do {
    lVar8 = 0;
    do {
      pTVar6 = (TestNode *)operator_new(0x70);
      pTVar3 = local_1f8->m_testCtx;
      iVar1 = (&DAT_00b15da4)[lVar8];
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      poVar7 = (ostream *)
               std::ostream::operator<<((ostringstream *)local_1a8,local_1d8[local_250 * 2]);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"x",1);
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,local_1d8[local_250 * 2 + 1]);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"_",1);
      std::ostream::operator<<(poVar7,iVar1);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base(local_138);
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)pTVar6,pTVar3,local_240._M_dataplus._M_p,"");
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_240._M_dataplus._M_p != &local_240.field_2) {
        operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
      }
      local_1f0 = 0;
      local_1e8 = pTVar6;
      local_1b8 = lVar8;
      do {
        pTVar6 = (TestNode *)operator_new(0x70);
        pTVar3 = local_1f8->m_testCtx;
        local_1dc = (&DAT_00b15300)[local_1f0];
        __s = ::vk::getFormatName(local_1dc);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_1a8,__s,(allocator<char> *)&local_240);
        std::__cxx11::string::substr((ulong)&local_240,(ulong)local_1a8);
        de::toLower(&local_218,&local_240);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_240._M_dataplus._M_p != &local_240.field_2) {
          operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
        }
        if (local_1a8[0] != local_198) {
          operator_delete(local_1a8[0],local_198[0] + 1);
        }
        tcu::TestCaseGroup::TestCaseGroup
                  ((TestCaseGroup *)pTVar6,pTVar3,local_218._M_dataplus._M_p,"");
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_218._M_dataplus._M_p != &local_218.field_2) {
          operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
        }
        lVar8 = 0;
        local_220 = pTVar6;
        do {
          pTVar6 = local_220;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"samples_",8);
          iVar2 = *(int *)((long)&DAT_00b15350 + lVar8);
          std::ostream::operator<<((ostringstream *)local_1a8,iVar2);
          local_1b0 = lVar8;
          pcVar4 = *(pointer *)(local_1d8 + local_250 * 2);
          std::__cxx11::stringbuf::str();
          local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"");
          pTVar3 = pTVar6->m_testCtx;
          pTVar6 = (TestNode *)operator_new(0x98);
          tcu::TestCase::TestCase
                    ((TestCase *)pTVar6,pTVar3,NODETYPE_SELF_VALIDATE,local_240._M_dataplus._M_p,
                     local_218._M_dataplus._M_p);
          pTVar6->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d58480;
          pTVar6[1]._vptr_TestNode = local_1c8;
          pTVar6[1].m_testCtx = local_1c0;
          pTVar6[1].m_name._M_dataplus._M_p = pcVar4;
          *(int *)&pTVar6[1].m_name._M_string_length = iVar1;
          *(VkFormat *)((long)&pTVar6[1].m_name._M_string_length + 4) = local_1dc;
          *(int *)&pTVar6[1].m_name.field_2 = iVar2;
          tcu::TestNode::addChild(local_220,pTVar6);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_218._M_dataplus._M_p != &local_218.field_2) {
            operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
          }
          lVar8 = local_1b0;
          lVar5 = local_1b8;
          pTVar6 = local_1e8;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_240._M_dataplus._M_p != &local_240.field_2) {
            operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
          std::ios_base::~ios_base(local_138);
          lVar8 = lVar8 + 4;
        } while (lVar8 != 0x18);
        tcu::TestNode::addChild(pTVar6,local_220);
        local_1f0 = local_1f0 + 1;
      } while (local_1f0 != 4);
      tcu::TestNode::addChild(local_1f8,pTVar6);
      lVar8 = lVar5 + 1;
    } while (lVar5 == 0);
    bVar9 = local_250 == 0;
    local_250 = local_250 + 1;
  } while (bVar9);
  return;
}

Assistant:

void addTestCasesWithFunctions (tcu::TestCaseGroup*						group,
								FunctionPrograms1<CaseDef>::Function	initPrograms,
								FunctionInstance1<CaseDef>::Function	testFunc)
{
	const IVec2 size[] =
	{
		IVec2(64, 64),
		IVec2(79, 31),
	};
	const int numLayers[] =
	{
		1, 4
	};
	const VkSampleCountFlagBits samples[] =
	{
		VK_SAMPLE_COUNT_2_BIT,
		VK_SAMPLE_COUNT_4_BIT,
		VK_SAMPLE_COUNT_8_BIT,
		VK_SAMPLE_COUNT_16_BIT,
		VK_SAMPLE_COUNT_32_BIT,
		VK_SAMPLE_COUNT_64_BIT,
	};
	const VkFormat format[] =
	{
		VK_FORMAT_R8G8B8A8_UNORM,
		VK_FORMAT_R32_UINT,
		VK_FORMAT_R16G16_SINT,
		VK_FORMAT_R32G32B32A32_SFLOAT,
	};

	for (int sizeNdx = 0; sizeNdx < DE_LENGTH_OF_ARRAY(size); ++sizeNdx)
	for (int layerNdx = 0; layerNdx < DE_LENGTH_OF_ARRAY(numLayers); ++layerNdx)
	{
		MovePtr<tcu::TestCaseGroup>	sizeLayerGroup(new tcu::TestCaseGroup(group->getTestContext(), getSizeLayerString(size[sizeNdx], numLayers[layerNdx]).c_str(), ""));
		for (int formatNdx = 0; formatNdx < DE_LENGTH_OF_ARRAY(format); ++formatNdx)
		{
			MovePtr<tcu::TestCaseGroup>	formatGroup(new tcu::TestCaseGroup(group->getTestContext(), getFormatString(format[formatNdx]).c_str(), ""));
			for (int samplesNdx = 0; samplesNdx < DE_LENGTH_OF_ARRAY(samples); ++samplesNdx)
			{
				std::ostringstream caseName;
				caseName << "samples_" << getNumSamples(samples[samplesNdx]);

				const CaseDef caseDef =
				{
					size[sizeNdx],			// IVec2					renderSize;
					numLayers[layerNdx],	// int						numLayers;
					format[formatNdx],		// VkFormat					colorFormat;
					samples[samplesNdx],	// VkSampleCountFlagBits	numSamples;
				};

				addFunctionCaseWithPrograms(formatGroup.get(), caseName.str(), "", initPrograms, testFunc, caseDef);
			}
			sizeLayerGroup->addChild(formatGroup.release());
		}
		group->addChild(sizeLayerGroup.release());
	}
}